

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgparser.cpp
# Opt level: O1

void __thiscall lunasvg::parseInlineStyle(lunasvg *this,string_view input,SVGElement *element)

{
  byte bVar1;
  lunasvg *plVar2;
  PropertyID id;
  byte *pbVar3;
  lunasvg *plVar4;
  string name;
  string value;
  string_view local_90;
  char *local_80;
  size_t local_78;
  char local_70;
  undefined7 uStack_6f;
  string local_60;
  string_view local_40;
  
  local_80 = &local_70;
  local_78 = 0;
  local_70 = '\0';
  local_90._M_len = (size_t)this;
  local_90._M_str = (char *)input._M_len;
  if (this != (lunasvg *)0x0) {
    plVar2 = this + -1;
    local_90._M_len = (size_t)this;
    do {
      plVar4 = plVar2;
      pbVar3 = (byte *)local_90._M_str + 1;
      if ((0x20 < (ulong)(byte)*local_90._M_str) ||
         ((0x100002600U >> ((ulong)(byte)*local_90._M_str & 0x3f) & 1) == 0)) break;
      plVar2 = plVar4 + -1;
      local_90._M_str = (char *)pbVar3;
      local_90._M_len = (size_t)plVar4;
    } while (plVar4 != (lunasvg *)0x0);
  }
  if ((lunasvg *)local_90._M_len == (lunasvg *)0x0) {
LAB_0011c818:
    if (local_80 != &local_70) {
      operator_delete(local_80,CONCAT71(uStack_6f,local_70) + 1);
    }
    return;
  }
LAB_0011c686:
  bVar1 = *local_90._M_str;
  if ((((int)(char)(bVar1 & 0xdf) - 0x41U < 0x1a) || (bVar1 == 0x5f)) || (bVar1 == 0x2d)) {
    local_78 = 0;
    *local_80 = '\0';
    std::__cxx11::string::push_back((char)&local_80);
    while( true ) {
      local_90._M_str = local_90._M_str + 1;
      local_90._M_len = local_90._M_len + -1;
      pbVar3 = (byte *)local_90._M_str;
      plVar2 = (lunasvg *)local_90._M_len;
      if ((lunasvg *)local_90._M_len == (lunasvg *)0x0) break;
      bVar1 = *local_90._M_str;
      if (((0x19 < ((int)(char)bVar1 & 0xffffffdfU) - 0x41) && (bVar1 != 0x2d)) &&
         ((bVar1 != 0x5f && (9 < (int)(char)bVar1 - 0x30U)))) break;
      std::__cxx11::string::push_back((char)&local_80);
    }
    do {
      local_90._M_len = (size_t)plVar2;
      local_90._M_str = (char *)pbVar3;
      if ((lunasvg *)local_90._M_len == (lunasvg *)0x0) goto LAB_0011c750;
      if ((0x20 < (ulong)(byte)*local_90._M_str) ||
         (pbVar3 = (byte *)local_90._M_str + 1, plVar2 = (lunasvg *)(local_90._M_len + -1),
         (0x100002600U >> ((ulong)(byte)*local_90._M_str & 0x3f) & 1) == 0)) goto LAB_0011c750;
    } while( true );
  }
  goto LAB_0011c818;
LAB_0011c750:
  if (((lunasvg *)local_90._M_len == (lunasvg *)0x0) || (*local_90._M_str != 0x3a))
  goto LAB_0011c818;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  while( true ) {
    local_90._M_len = local_90._M_len + -1;
    local_90._M_str = (char *)((byte *)local_90._M_str + 1);
    if (((lunasvg *)local_90._M_len == (lunasvg *)0x0) || (*local_90._M_str == 0x3b)) break;
    std::__cxx11::string::push_back((char)&local_60);
  }
  local_40._M_len = local_78;
  local_40._M_str = local_80;
  id = csspropertyid(&local_40);
  if (id != Unknown) {
    SVGElement::setAttribute((SVGElement *)input._M_str,0x100,id,&local_60);
  }
  skipOptionalSpacesOrDelimiter(&local_90,';');
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,
                    CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                             local_60.field_2._M_local_buf[0]) + 1);
  }
  if ((lunasvg *)local_90._M_len == (lunasvg *)0x0) goto LAB_0011c818;
  goto LAB_0011c686;
}

Assistant:

inline void parseInlineStyle(std::string_view input, SVGElement* element)
{
    std::string name;
    skipOptionalSpaces(input);
    while(readCSSIdentifier(input, name)) {
        skipOptionalSpaces(input);
        if(!skipDelimiter(input, ':'))
            return;
        std::string value;
        while(!input.empty() && input.front() != ';') {
            value.push_back(input.front());
            input.remove_prefix(1);
        }

        auto id = csspropertyid(name);
        if(id != PropertyID::Unknown)
            element->setAttribute(0x100, id, value);
        skipOptionalSpacesOrDelimiter(input, ';');
    }
}